

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

size_t atohex(uchar *b,size_t bsize,char *p,size_t psize)

{
  char cVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  sVar2 = 0;
  for (; (sVar2 != 0x14 && ((char *)0x1 < p)); p = p + -2) {
    cVar1 = *(char *)(bsize + sVar2 * 2);
    if (((byte)(cVar1 + 0x9fU) < 0x1a) || ((byte)(cVar1 + 0xbfU) < 0x1a)) {
      bVar3 = cVar1 * '\x10' + 0x90;
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) {
        return 0xffffffffffffffff;
      }
      bVar3 = cVar1 << 4;
    }
    cVar1 = *(char *)(bsize + 1 + sVar2 * 2);
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      bVar4 = cVar1 + 0xa9;
    }
    else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
      bVar4 = cVar1 - 0x37;
    }
    else {
      bVar4 = cVar1 - 0x30;
      if (9 < bVar4) {
        return 0xffffffffffffffff;
      }
    }
    b[sVar2] = bVar4 | bVar3;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t
atohex(unsigned char *b, size_t bsize, const char *p, size_t psize)
{
	size_t fbsize = bsize;

	while (bsize && psize > 1) {
		unsigned char x;

		if (p[0] >= 'a' && p[0] <= 'z')
			x = (p[0] - 'a' + 0x0a) << 4;
		else if (p[0] >= 'A' && p[0] <= 'Z')
			x = (p[0] - 'A' + 0x0a) << 4;
		else if (p[0] >= '0' && p[0] <= '9')
			x = (p[0] - '0') << 4;
		else
			return (-1);
		if (p[1] >= 'a' && p[1] <= 'z')
			x |= p[1] - 'a' + 0x0a;
		else if (p[1] >= 'A' && p[1] <= 'Z')
			x |= p[1] - 'A' + 0x0a;
		else if (p[1] >= '0' && p[1] <= '9')
			x |= p[1] - '0';
		else
			return (-1);

		*b++ = x;
		bsize--;
		p += 2;
		psize -= 2;
	}
	return (fbsize - bsize);
}